

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManFlowFindBestCut(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,int Num)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *vCone;
  void **ppvVar8;
  Vec_Ptr_t *vSet;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  Aig_Man_t *p_01;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  
  uVar2 = (long)(p->nObjs[6] + p->nObjs[5]) / (long)Num;
  iVar10 = (int)(((uint)(uVar2 >> 0x1f) & 1) + (int)uVar2) >> 1;
  iVar5 = Llb_ManCutVolume(p,vLower,vUpper);
  iVar6 = iVar5 - iVar10;
  if (iVar6 == 0 || iVar5 < iVar10) {
    __assert_fail("Vol > nVolMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                  ,0x48c,
                  "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)");
  }
  if (iVar10 < iVar6) {
    iVar6 = iVar10;
  }
  vCone = (Vec_Ptr_t *)malloc(0x10);
  vCone->nCap = 100;
  vCone->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  vCone->pArray = ppvVar8;
  vSet = (Vec_Ptr_t *)malloc(0x10);
  vSet->nCap = 100;
  vSet->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  vSet->pArray = ppvVar8;
  p_00 = p;
  Llb_ManFlowPrepareCut(p,vLower,vUpper);
  if (1 < p->nRegs) {
    iVar5 = vLower->nSize;
    local_50 = 1;
    local_58 = -1;
    local_4c = 1000000000;
    local_54 = 0;
    do {
      if (0 < iVar5) {
        iVar10 = 0;
        do {
          Llb_ManFlowGetObjSet(p_00,vLower,iVar10,local_50,vSet);
          p_00 = p;
          Llb_ManFlowCollectAndMarkCone(p,vSet,vCone);
          if (vCone->nSize != 0) {
            p_01 = p;
            p_00 = (Aig_Man_t *)Llb_ManFlowCompute(p);
            Llb_ManFlowUnmarkCone(p_01,vCone);
            iVar7 = Llb_ManCutVolume(p,vLower,(Vec_Ptr_t *)p_00);
            iVar5 = Llb_ManCutVolume(p,(Vec_Ptr_t *)p_00,vUpper);
            if (iVar7 < iVar5) {
              iVar5 = iVar7;
            }
            iVar7 = local_58;
            iVar3 = local_54;
            iVar4 = local_4c;
            if (((iVar6 <= iVar5) &&
                (iVar1 = *(int *)((long)&p_00->pName + 4), iVar7 = iVar10, iVar3 = iVar5,
                iVar4 = iVar1, local_4c <= iVar1 && local_4c != -1)) &&
               (iVar4 = local_4c, local_4c != iVar1 || iVar5 <= local_54)) {
              iVar7 = local_58;
              iVar3 = local_54;
            }
            local_4c = iVar4;
            local_54 = iVar3;
            local_58 = iVar7;
            if ((void **)p_00->pSpec != (void **)0x0) {
              free(p_00->pSpec);
            }
            free(p_00);
          }
          iVar10 = iVar10 + 1;
          iVar5 = vLower->nSize;
        } while (iVar10 < iVar5);
        if (-1 < local_58) {
          Llb_ManFlowGetObjSet(p_00,vLower,local_58,local_50,vSet);
          Llb_ManFlowCollectAndMarkCone(p,vSet,vCone);
          pVVar9 = Llb_ManFlowCompute(p);
          Llb_ManFlowUnmarkCone(p,vCone);
          if (vCone->pArray != (void **)0x0) {
            free(vCone->pArray);
          }
          free(vCone);
          ppvVar8 = vSet->pArray;
          goto LAB_007dbea4;
        }
      }
      local_50 = local_50 + 5;
    } while (local_50 < p->nRegs);
    if (local_58 != -1) {
      __assert_fail("iBest >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                    ,0x4b4,
                    "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)")
      ;
    }
  }
  if (vCone->pArray != (void **)0x0) {
    free(vCone->pArray);
  }
  free(vCone);
  ppvVar8 = vSet->pArray;
  pVVar9 = (Vec_Ptr_t *)0x0;
LAB_007dbea4:
  if (ppvVar8 != (void **)0x0) {
    free(ppvVar8);
  }
  free(vSet);
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowFindBestCut( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, int Num )
{
    int nVolMin = Aig_ManNodeNum(p) / Num / 2;
    Vec_Ptr_t * vMinCut;
    Vec_Ptr_t * vCone, * vSet;
    Aig_Obj_t * pObj;
    int i, s, Vol, VolLower, VolUpper, VolCmp;
    int iBest = -1, iMinCut = ABC_INFINITY, iVolBest = 0;

    Vol = Llb_ManCutVolume( p, vLower, vUpper );
    assert( Vol > nVolMin );
    VolCmp = Abc_MinInt( nVolMin, Vol - nVolMin );
    vCone = Vec_PtrAlloc( 100 );
    vSet  = Vec_PtrAlloc( 100 );
    Llb_ManFlowPrepareCut( p, vLower, vUpper );
    for ( s = 1; s < Aig_ManRegNum(p); s += 5 )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        {
            Llb_ManFlowGetObjSet( p, vLower, i, s, vSet );
            Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
            if ( Vec_PtrSize(vCone) == 0 )
                continue;
            vMinCut  = Llb_ManFlowCompute( p );
            Llb_ManFlowUnmarkCone( p, vCone );

            VolLower = Llb_ManCutVolume( p, vLower, vMinCut );
            VolUpper = Llb_ManCutVolume( p, vMinCut, vUpper );
            Vol = Abc_MinInt( VolLower, VolUpper );
            if ( Vol >= VolCmp &&  (iMinCut == -1 || 
                                    iMinCut >  Vec_PtrSize(vMinCut) || 
                                   (iMinCut == Vec_PtrSize(vMinCut) && iVolBest < Vol)) )
            {
                iBest = i;
                iMinCut = Vec_PtrSize(vMinCut);
                iVolBest = Vol;
            }
            Vec_PtrFree( vMinCut );
        }
        if ( iBest >= 0 )
            break;
    }
    if ( iBest == -1 )
    {
        // cleanup
        Vec_PtrFree( vCone );
        Vec_PtrFree( vSet );
        return NULL;
    }
    // get the best cut
    assert( iBest >= 0 );
    Llb_ManFlowGetObjSet( p, vLower, iBest, s, vSet );
    Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
    vMinCut = Llb_ManFlowCompute( p );
    Llb_ManFlowUnmarkCone( p, vCone );
    // cleanup
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSet );
    return vMinCut;
}